

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::get_codes_to_canonical_deg<4,long>(Omega_h *this,Read<int> *ev2v)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  int size_in;
  size_t sVar6;
  Read<signed_char> RVar7;
  Write<signed_char> codes;
  type f;
  Write<signed_char> local_68;
  string local_50;
  Write<signed_char> local_30;
  
  pAVar2 = (ev2v->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar6 = pAVar2->size;
  }
  else {
    sVar6 = (ulong)pAVar2 >> 3;
  }
  if ((sVar6 >> 3 & 3) == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    size_in = (int)(sVar6 >> 3) >> 2;
    Write<signed_char>::Write(&local_68,size_in,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)(ev2v->write_).shared_alloc_.alloc;
    if (((ulong)local_50._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_50._M_dataplus._M_p != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50._M_dataplus._M_p = (pointer)(((Alloc *)local_50._M_dataplus._M_p)->size * 8 + 1);
      }
      else {
        ((Alloc *)local_50._M_dataplus._M_p)->use_count =
             ((Alloc *)local_50._M_dataplus._M_p)->use_count + 1;
      }
    }
    local_50._M_string_length = (size_type)(ev2v->write_).shared_alloc_.direct_ptr;
    local_50.field_2._M_allocated_capacity = (size_type)local_68.shared_alloc_.alloc;
    if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
        local_68.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50.field_2._M_allocated_capacity = (local_68.shared_alloc_.alloc)->size * 8 + 1;
      }
      else {
        (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_50.field_2._8_8_ = local_68.shared_alloc_.direct_ptr;
    parallel_for<Omega_h::get_codes_to_canonical_deg<4,long>(Omega_h::Read<long>)::_lambda(int)_1_>
              (size_in,(type *)&local_50);
    local_30.shared_alloc_.alloc = local_68.shared_alloc_.alloc;
    local_30.shared_alloc_.direct_ptr = local_68.shared_alloc_.direct_ptr;
    if ((((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
         local_68.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + -1;
      local_30.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_68.shared_alloc_.alloc = (Alloc *)0x0;
    local_68.shared_alloc_.direct_ptr = (void *)0x0;
    Read<signed_char>::Read((Read<signed_char> *)this,&local_30);
    pAVar2 = local_30.shared_alloc_.alloc;
    pvVar5 = extraout_RDX;
    if (((ulong)local_30.shared_alloc_.alloc & 7) == 0 &&
        local_30.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_30.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_00;
      }
    }
    uVar4 = local_50.field_2._M_allocated_capacity;
    if ((local_50.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_50.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_50.field_2._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_50.field_2._M_allocated_capacity);
        operator_delete((void *)uVar4,0x48);
        pvVar5 = extraout_RDX_01;
      }
    }
    _Var3._M_p = local_50._M_dataplus._M_p;
    if (((ulong)local_50._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_50._M_dataplus._M_p != (Alloc *)0x0) {
      piVar1 = (int *)(local_50._M_dataplus._M_p + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_50._M_dataplus._M_p);
        operator_delete(_Var3._M_p,0x48);
        pvVar5 = extraout_RDX_02;
      }
    }
    pAVar2 = local_68.shared_alloc_.alloc;
    if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
        local_68.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_03;
      }
    }
    RVar7.write_.shared_alloc_.direct_ptr = pvVar5;
    RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar7.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

Read<I8> get_codes_to_canonical_deg(Read<T> const ev2v) {
  auto const nev = ev2v.size();
  auto const ne = divide_no_remainder(nev, deg);
  Write<I8> codes(ne);
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto const begin = e * deg;
    /* find the smallest vertex */
    Int min_j = 0;
    auto min_v = ev2v[begin];
    for (Int j = 1; j < deg; ++j) {
      auto const ev = j + begin;
      auto const v = ev2v[ev];
      if (v < min_v) {
        min_j = j;
        min_v = v;
      }
    }
    /* rotate to make it first */
    auto const rotation = rotation_to_first(deg, min_j);
    T tmp[deg];
    rotate_adj<deg>(rotation, ev2v, begin, tmp, 0);
    auto const is_flipped = IsFlipped<deg>::is(tmp);
    codes[e] = make_code(is_flipped, rotation, 0);
  };
  parallel_for(ne, std::move(f));
  return codes;
}